

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall FIX::SocketInitiator::doConnect(SocketInitiator *this,SessionID *s,Dictionary *d)

{
  short sVar1;
  bool bVar2;
  int s_00;
  Session *pSVar3;
  SocketConnection *this_00;
  mapped_type *ppSVar4;
  signed_int value;
  signed_int value_00;
  Log *pLVar5;
  short sourcePort;
  short port;
  socket_handle result;
  string address;
  string sourceAddress;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  address._M_dataplus._M_p = (pointer)&address.field_2;
  address._M_string_length = 0;
  address.field_2._M_local_buf[0] = '\0';
  port = 0;
  sourceAddress._M_dataplus._M_p = (pointer)&sourceAddress.field_2;
  sourceAddress._M_string_length = 0;
  sourceAddress.field_2._M_local_buf[0] = '\0';
  sourcePort = 0;
  pSVar3 = Session::lookupSession(s);
  UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&result);
  bVar2 = TimeRange::isInRange(&pSVar3->m_sessionTime,(UtcTimeStamp *)&result);
  if (bVar2) {
    getHost(this,s,d,&address,&port,&sourceAddress,&sourcePort);
    std::operator+(&local_110,"Connecting to ",&address);
    std::operator+(&local_f0,&local_110," on port ");
    sVar1 = port;
    IntConvertor::convert_abi_cxx11_(&local_130,(IntConvertor *)(ulong)(ushort)port,value);
    std::operator+(&local_d0,&local_f0,&local_130);
    std::operator+(&local_b0,&local_d0," (Source ");
    std::operator+(&local_90,&local_b0,&sourceAddress);
    std::operator+(&local_70,&local_90,":");
    IntConvertor::convert_abi_cxx11_(&local_150,(IntConvertor *)(ulong)(ushort)sourcePort,value_00);
    std::operator+(&local_50,&local_70,&local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_50,")");
    pLVar5 = &(pSVar3->m_state).super_Log;
    (*pLVar5->_vptr_Log[6])(pLVar5,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    s_00 = SocketConnector::connect
                     (&this->m_connector,(int)&address,(sockaddr *)(ulong)(uint)(int)sVar1,
                      (uint)this->m_noDelay);
    result = s_00;
    Initiator::setPending(&this->super_Initiator,s);
    this_00 = (SocketConnection *)operator_new(0x2180);
    SocketConnection::SocketConnection(this_00,this,s,s_00,&(this->m_connector).m_monitor);
    ppSVar4 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_pendingConnections,&result);
    *ppSVar4 = this_00;
  }
  std::__cxx11::string::~string((string *)&sourceAddress);
  std::__cxx11::string::~string((string *)&address);
  return;
}

Assistant:

void SocketInitiator::doConnect( const SessionID& s, const Dictionary& d )
{
  try
  {
    std::string address;
    short port = 0;
    std::string sourceAddress;
    short sourcePort = 0;

    Session* session = Session::lookupSession( s );
    if( !session->isSessionTime(UtcTimeStamp()) ) return;

    Log* log = session->getLog();

    getHost( s, d, address, port, sourceAddress, sourcePort );

    log->onEvent( "Connecting to " + address + " on port " + IntConvertor::convert((unsigned short)port) + " (Source " + sourceAddress + ":" + IntConvertor::convert((unsigned short)sourcePort) + ")");
    socket_handle result = m_connector.connect( address, port, m_noDelay, m_sendBufSize, m_rcvBufSize, sourceAddress, sourcePort );
    setPending( s );

    m_pendingConnections[ result ] 
      = new SocketConnection( *this, s, result, &m_connector.getMonitor() );
  }
  catch ( std::exception& ) {}
}